

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::regexp_object,mjs::gc_heap_ptr<mjs::global_object>const&,mjs::gc_heap_ptr<mjs::object>,mjs::string,mjs::regexp_flag&>
          (gc_heap *this,size_t num_bytes,gc_heap_ptr<mjs::global_object> *args,
          gc_heap_ptr<mjs::object> *args_1,string *args_2,regexp_flag *args_3)

{
  slot *this_00;
  undefined8 extraout_RDX;
  allocation_result aVar1;
  gc_heap_ptr<mjs::regexp_object> gVar2;
  regexp_flag *in_stack_00000008;
  
  aVar1 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  this_00 = aVar1.obj;
  if (*(int *)((long)this_00 + -4) == -1) {
    regexp_object::regexp_object
              ((regexp_object *)&this_00->allocation,(gc_heap_ptr<mjs::global_object> *)args_1,
               (object_ptr *)args_2,(string *)args_3,*in_stack_00000008);
    *(undefined4 *)((long)this_00 + -4) = gc_type_info_registration<mjs::regexp_object>::reg._40_4_;
    (this->pointers_).set_ = (gc_heap_ptr_untyped **)num_bytes;
    (this->pointers_).capacity_ = aVar1.pos;
    attach((gc_heap *)num_bytes,(gc_heap_ptr_untyped *)this);
    gVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar2.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::regexp_object>)gVar2.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::regexp_object, Args = <const mjs::gc_heap_ptr<mjs::global_object> &, mjs::gc_heap_ptr<mjs::object>, mjs::string, mjs::regexp_flag &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}